

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall QThread::setPriority(QThread *this,Priority priority)

{
  QThreadPrivate *this_00;
  long in_FS_OFFSET;
  QMessageLogger local_48;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (priority == InheritPriority) {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context._4_8_ = 0;
    local_48.context._12_8_ = 0;
    local_48.context.category = "default";
    QMessageLogger::warning(&local_48,"QThread::setPriority: Argument cannot be InheritPriority");
  }
  else {
    this_00 = (QThreadPrivate *)(this->super_QObject).d_ptr.d;
    local_28._0_8_ = &this_00->mutex;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
    local_28[8] = true;
    if (this_00->threadState == Running) {
      QThreadPrivate::setPriority(this_00,priority);
    }
    else {
      local_48.context.version = 2;
      local_48.context.function._4_4_ = 0;
      local_48.context._4_8_ = 0;
      local_48.context._12_8_ = 0;
      local_48.context.category = "default";
      QMessageLogger::warning
                (&local_48,"QThread::setPriority: Cannot set priority, thread is not running");
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThread::setPriority(Priority priority)
{
    if (priority == QThread::InheritPriority) {
        qWarning("QThread::setPriority: Argument cannot be InheritPriority");
        return;
    }
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);
    if (d->threadState != QThreadPrivate::Running) {
        qWarning("QThread::setPriority: Cannot set priority, thread is not running");
        return;
    }
    d->setPriority(priority);
}